

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegd_parser.c
# Opt level: O0

MPP_RET jpegd_callback(void *decoder,void *err_info)

{
  MppFrame local_48;
  MppFrame frame;
  RK_U32 err_mark;
  RK_S32 output;
  RK_U32 hw_dec_err;
  RK_U32 task_err;
  HalDecTask *task_dec;
  DecCbHalDone *ctx;
  JpegdCtx *JpegCtx;
  void *err_info_local;
  void *decoder_local;
  
  _hw_dec_err = *err_info;
  output = (uint)(*(ulong *)(_hw_dec_err + 8) >> 2) & 1;
  err_mark = *(RK_U32 *)((long)err_info + 0x10);
  frame._4_4_ = *(int *)(_hw_dec_err + 0x34);
  frame._0_4_ = 0;
  local_48 = (MppFrame)0x0;
  task_dec = (HalDecTask *)err_info;
  ctx = (DecCbHalDone *)decoder;
  JpegCtx = (JpegdCtx *)err_info;
  err_info_local = decoder;
  if (-1 < frame._4_4_) {
    mpp_buf_slot_get_prop(*(MppBufSlots *)((long)decoder + 8),frame._4_4_,SLOT_FRAME_PTR,&local_48);
  }
  if (local_48 != (MppFrame)0x0) {
    if (output == 0) {
      if (err_mark != 0) {
        frame._0_4_ = (uint)frame | 0x100;
      }
    }
    else {
      frame._0_4_ = (uint)frame | 0x10;
    }
    if ((uint)frame != 0) {
      mpp_frame_set_errinfo(local_48,(uint)frame);
    }
  }
  return MPP_OK;
}

Assistant:

static MPP_RET jpegd_callback(void *decoder, void *err_info)
{
    JpegdCtx *JpegCtx = (JpegdCtx *)decoder;
    DecCbHalDone *ctx = (DecCbHalDone *)err_info;
    HalDecTask *task_dec = (HalDecTask *)ctx->task;
    RK_U32 task_err = task_dec->flags.parse_err;
    RK_U32 hw_dec_err = ctx->hard_err;
    RK_S32 output = task_dec->output;
    RK_U32 err_mark = 0;
    MppFrame frame = NULL;

    if (output >= 0)
        mpp_buf_slot_get_prop(JpegCtx->frame_slots, output, SLOT_FRAME_PTR, &frame);

    if (!frame)
        goto __RETURN;

    /* check and mark current frame */
    if (task_err)
        err_mark |= MPP_FRAME_ERR_DEC_INVALID;
    else if (hw_dec_err)
        err_mark |= MPP_FRAME_ERR_DEC_HW_ERR;
    if (err_mark)
        mpp_frame_set_errinfo(frame, err_mark);

__RETURN:
    return MPP_OK;
}